

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

SPVFuncImpl __thiscall
spirv_cross::CompilerMSL::OpCodePreprocessor::get_spv_func_impl
          (OpCodePreprocessor *this,Op opcode,uint32_t *args,uint32_t length)

{
  CompilerMSL *pCVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  pointer ppVar5;
  SPIRVariable *pSVar6;
  SPIRType *pSVar7;
  mapped_type *pmVar8;
  SPIRExtension *pSVar9;
  bool local_9b;
  SPVFuncImpl local_99;
  bool local_89;
  SPIRType *mat_type;
  SPIRType *type_2;
  SPIRType *type_1;
  SPIRType *type;
  GLSLstd450 op_450;
  uint32_t extension_set;
  uint32_t tid_1;
  uint32_t tid;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_40;
  iterator it;
  ID local_30;
  uint32_t local_2c;
  uint32_t *puStack_28;
  uint32_t length_local;
  uint32_t *args_local;
  OpCodePreprocessor *pOStack_18;
  Op opcode_local;
  OpCodePreprocessor *this_local;
  
  local_2c = length;
  puStack_28 = args;
  args_local._4_4_ = opcode;
  pOStack_18 = this;
  if (opcode != OpExtInst) {
    if (opcode == OpTypeArray) {
      return SPVFuncImplUnsafeArray;
    }
    if ((opcode == OpImageFetch) || (opcode - OpImageRead < 2)) {
      iVar3 = 2;
      if (opcode == OpImageWrite) {
        iVar3 = 0;
      }
      pmVar8 = ::std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->result_types,args + iVar3);
      if (((*pmVar8 != 0) &&
          (pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,*pmVar8),
          (pSVar7->image).dim == DimBuffer)) &&
         (((this->compiler->msl_options).texture_buffer_native & 1U) == 0)) {
        return SPVFuncImplTexelBufferCoords;
      }
    }
    else {
      if (opcode == OpQuantizeToF16) {
        return SPVFuncImplQuantizeToF16;
      }
      if ((opcode == OpFAdd) || (opcode == OpFSub)) {
        local_89 = true;
        if (((this->compiler->msl_options).invariant_float_math & 1U) == 0) {
          pCVar1 = this->compiler;
          TypedID<(spirv_cross::Types)0>::TypedID(&local_30,args[1]);
          local_89 = Compiler::has_decoration((Compiler *)pCVar1,local_30,DecorationNoContraction);
        }
        if (local_89 != false) {
          local_99 = SPVFuncImplFAdd;
          if (args_local._4_4_ != OpFAdd) {
            local_99 = SPVFuncImplFSub;
          }
          return local_99;
        }
      }
      else {
        if (opcode != OpFMul) {
          if (opcode == OpFMod) {
            return SPVFuncImplMod;
          }
          if (3 < opcode - OpVectorTimesMatrix) {
            if (opcode - OpUMulExtended < 2) {
              return SPVFuncImplMulExtended;
            }
            if (0xf < opcode - OpAtomicLoad) {
              if (opcode == OpGroupNonUniformAllEqual) {
                return SPVFuncImplSubgroupAllEqual;
              }
              if (opcode == OpGroupNonUniformBroadcast) {
                return SPVFuncImplSubgroupBroadcast;
              }
              if (opcode == OpGroupNonUniformBroadcastFirst) {
                return SPVFuncImplSubgroupBroadcastFirst;
              }
              if (opcode == OpGroupNonUniformBallot) {
                return SPVFuncImplSubgroupBallot;
              }
              if (opcode - OpGroupNonUniformInverseBallot < 2) {
                return SPVFuncImplSubgroupBallotBitExtract;
              }
              if (opcode == OpGroupNonUniformBallotBitCount) {
                return SPVFuncImplSubgroupBallotBitCount;
              }
              if (opcode == OpGroupNonUniformBallotFindLSB) {
                return SPVFuncImplSubgroupBallotFindLSB;
              }
              if (opcode == OpGroupNonUniformBallotFindMSB) {
                return SPVFuncImplSubgroupBallotFindMSB;
              }
              if (opcode == OpGroupNonUniformShuffle) {
                return SPVFuncImplSubgroupShuffle;
              }
              if (opcode == OpGroupNonUniformShuffleXor) {
                return SPVFuncImplSubgroupShuffleXor;
              }
              if (opcode == OpGroupNonUniformShuffleUp) {
                return SPVFuncImplSubgroupShuffleUp;
              }
              if (opcode == OpGroupNonUniformShuffleDown) {
                return SPVFuncImplSubgroupShuffleDown;
              }
              if (opcode == OpGroupNonUniformQuadBroadcast) {
                return SPVFuncImplQuadBroadcast;
              }
              if (opcode == OpGroupNonUniformQuadSwap) {
                return SPVFuncImplQuadSwap;
              }
              if (opcode == OpSubgroupBallotKHR) {
                return SPVFuncImplSubgroupBallot;
              }
              if (opcode == OpSubgroupFirstInvocationKHR) {
                return SPVFuncImplSubgroupBroadcastFirst;
              }
              if (opcode == OpSubgroupAllEqualKHR) {
                return SPVFuncImplSubgroupAllEqual;
              }
              if (opcode == OpGroupNonUniformRotateKHR) {
                if (length < 6) {
                  return SPVFuncImplSubgroupRotate;
                }
                return SPVFuncImplSubgroupShuffle;
              }
              if (opcode == OpSubgroupReadInvocationKHR) {
                return SPVFuncImplSubgroupBroadcast;
              }
              if (opcode - OpSDot < 6) {
                return SPVFuncImplReduceAdd;
              }
              if (opcode - OpAssumeTrueKHR < 2) {
                return SPVFuncImplAssume;
              }
              if (opcode != OpAtomicFAddEXT) goto LAB_003090b9;
            }
            iVar3 = 2;
            if (opcode == OpAtomicStore) {
              iVar3 = 0;
            }
            local_40._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::find(&this->image_pointers_emulated,args + iVar3);
            _tid_1 = (__node_type *)
                     ::std::
                     unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::end(&this->image_pointers_emulated);
            bVar2 = ::std::__detail::operator!=
                              (&local_40,
                               (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                *)&tid_1);
            if (bVar2) {
              pCVar1 = this->compiler;
              ppVar5 = ::std::__detail::
                       _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                       operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                   *)&local_40);
              pSVar6 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)pCVar1,ppVar5->second);
              uVar4 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(pSVar6->super_IVariant).field_0xc);
              if ((uVar4 != 0) &&
                 (pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,uVar4),
                 (pSVar7->image).dim == Dim2D)) {
                return SPVFuncImplImage2DAtomicCoords;
              }
            }
            goto LAB_003090b9;
          }
        }
        local_9b = true;
        if (((this->compiler->msl_options).invariant_float_math & 1U) == 0) {
          pCVar1 = this->compiler;
          TypedID<(spirv_cross::Types)0>::TypedID
                    ((TypedID<(spirv_cross::Types)0> *)
                     ((long)&it.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                             ._M_cur + 4),args[1]);
          local_9b = Compiler::has_decoration
                               ((Compiler *)pCVar1,
                                it.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                ._M_cur._4_4_,DecorationNoContraction);
        }
        if (local_9b != false) {
          return SPVFuncImplFMul;
        }
      }
    }
    goto LAB_003090b9;
  }
  pSVar9 = Compiler::get<spirv_cross::SPIRExtension>((Compiler *)this->compiler,args[2]);
  if (*(int *)&(pSVar9->super_IVariant).field_0xc != 1) goto LAB_003090b9;
  switch(puStack_28[3]) {
  case 7:
    this_local._7_1_ = SPVFuncImplSSign;
    break;
  default:
    goto LAB_003090b9;
  case 0xb:
    this_local._7_1_ = SPVFuncImplRadians;
    break;
  case 0xc:
    this_local._7_1_ = SPVFuncImplDegrees;
    break;
  case 0x22:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,*puStack_28);
    uVar4 = pSVar7->columns;
    if (uVar4 == 2) {
      return SPVFuncImplInverse2x2;
    }
    if (uVar4 == 3) {
      return SPVFuncImplInverse3x3;
    }
    if (uVar4 == 4) {
      return SPVFuncImplInverse4x4;
    }
    goto LAB_003090b9;
  case 0x46:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,*puStack_28);
    if (pSVar7->vecsize == 1) {
      return SPVFuncImplFaceForwardScalar;
    }
    goto LAB_003090b9;
  case 0x47:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,*puStack_28);
    if (pSVar7->vecsize == 1) {
      return SPVFuncImplReflectScalar;
    }
    goto LAB_003090b9;
  case 0x48:
    pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this->compiler,*puStack_28);
    if (pSVar7->vecsize == 1) {
      return SPVFuncImplRefractScalar;
    }
LAB_003090b9:
    this_local._7_1_ = SPVFuncImplNone;
    break;
  case 0x49:
    this_local._7_1_ = SPVFuncImplFindILsb;
    break;
  case 0x4a:
    this_local._7_1_ = SPVFuncImplFindSMsb;
    break;
  case 0x4b:
    this_local._7_1_ = SPVFuncImplFindUMsb;
  }
  return this_local._7_1_;
}

Assistant:

CompilerMSL::SPVFuncImpl CompilerMSL::OpCodePreprocessor::get_spv_func_impl(Op opcode, const uint32_t *args, uint32_t length)
{
	switch (opcode)
	{
	case OpFMod:
		return SPVFuncImplMod;

	case OpFAdd:
	case OpFSub:
		if (compiler.msl_options.invariant_float_math ||
		    compiler.has_decoration(args[1], DecorationNoContraction))
		{
			return opcode == OpFAdd ? SPVFuncImplFAdd : SPVFuncImplFSub;
		}
		break;

	case OpFMul:
	case OpOuterProduct:
	case OpMatrixTimesVector:
	case OpVectorTimesMatrix:
	case OpMatrixTimesMatrix:
		if (compiler.msl_options.invariant_float_math ||
		    compiler.has_decoration(args[1], DecorationNoContraction))
		{
			return SPVFuncImplFMul;
		}
		break;

	case OpQuantizeToF16:
		return SPVFuncImplQuantizeToF16;

	case OpTypeArray:
	{
		// Allow Metal to use the array<T> template to make arrays a value type
		return SPVFuncImplUnsafeArray;
	}

	// Emulate texture2D atomic operations
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicFAddEXT:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpAtomicLoad:
	case OpAtomicStore:
	{
		auto it = image_pointers_emulated.find(args[opcode == OpAtomicStore ? 0 : 2]);
		if (it != image_pointers_emulated.end())
		{
			uint32_t tid = compiler.get<SPIRVariable>(it->second).basetype;
			if (tid && compiler.get<SPIRType>(tid).image.dim == Dim2D)
				return SPVFuncImplImage2DAtomicCoords;
		}
		break;
	}

	case OpImageFetch:
	case OpImageRead:
	case OpImageWrite:
	{
		// Retrieve the image type, and if it's a Buffer, emit a texel coordinate function
		uint32_t tid = result_types[args[opcode == OpImageWrite ? 0 : 2]];
		if (tid && compiler.get<SPIRType>(tid).image.dim == DimBuffer && !compiler.msl_options.texture_buffer_native)
			return SPVFuncImplTexelBufferCoords;
		break;
	}

	case OpExtInst:
	{
		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
		{
			auto op_450 = static_cast<GLSLstd450>(args[3]);
			switch (op_450)
			{
			case GLSLstd450Radians:
				return SPVFuncImplRadians;
			case GLSLstd450Degrees:
				return SPVFuncImplDegrees;
			case GLSLstd450FindILsb:
				return SPVFuncImplFindILsb;
			case GLSLstd450FindSMsb:
				return SPVFuncImplFindSMsb;
			case GLSLstd450FindUMsb:
				return SPVFuncImplFindUMsb;
			case GLSLstd450SSign:
				return SPVFuncImplSSign;
			case GLSLstd450Reflect:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplReflectScalar;
				break;
			}
			case GLSLstd450Refract:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplRefractScalar;
				break;
			}
			case GLSLstd450FaceForward:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplFaceForwardScalar;
				break;
			}
			case GLSLstd450MatrixInverse:
			{
				auto &mat_type = compiler.get<SPIRType>(args[0]);
				switch (mat_type.columns)
				{
				case 2:
					return SPVFuncImplInverse2x2;
				case 3:
					return SPVFuncImplInverse3x3;
				case 4:
					return SPVFuncImplInverse4x4;
				default:
					break;
				}
				break;
			}
			default:
				break;
			}
		}
		break;
	}

	case OpGroupNonUniformBroadcast:
	case OpSubgroupReadInvocationKHR:
		return SPVFuncImplSubgroupBroadcast;

	case OpGroupNonUniformBroadcastFirst:
	case OpSubgroupFirstInvocationKHR:
		return SPVFuncImplSubgroupBroadcastFirst;

	case OpGroupNonUniformBallot:
	case OpSubgroupBallotKHR:
		return SPVFuncImplSubgroupBallot;

	case OpGroupNonUniformInverseBallot:
	case OpGroupNonUniformBallotBitExtract:
		return SPVFuncImplSubgroupBallotBitExtract;

	case OpGroupNonUniformBallotFindLSB:
		return SPVFuncImplSubgroupBallotFindLSB;

	case OpGroupNonUniformBallotFindMSB:
		return SPVFuncImplSubgroupBallotFindMSB;

	case OpGroupNonUniformBallotBitCount:
		return SPVFuncImplSubgroupBallotBitCount;

	case OpGroupNonUniformAllEqual:
	case OpSubgroupAllEqualKHR:
		return SPVFuncImplSubgroupAllEqual;

	case OpGroupNonUniformShuffle:
		return SPVFuncImplSubgroupShuffle;

	case OpGroupNonUniformShuffleXor:
		return SPVFuncImplSubgroupShuffleXor;

	case OpGroupNonUniformShuffleUp:
		return SPVFuncImplSubgroupShuffleUp;

	case OpGroupNonUniformShuffleDown:
		return SPVFuncImplSubgroupShuffleDown;

	case OpGroupNonUniformRotateKHR:
		// Clustered rotate is performed using shuffle.
		if (length > 5)
			return SPVFuncImplSubgroupShuffle;
		return SPVFuncImplSubgroupRotate;

	case OpGroupNonUniformQuadBroadcast:
		return SPVFuncImplQuadBroadcast;

	case OpGroupNonUniformQuadSwap:
		return SPVFuncImplQuadSwap;

	case OpSDot:
	case OpUDot:
	case OpSUDot:
	case OpSDotAccSat:
	case OpUDotAccSat:
	case OpSUDotAccSat:
		return SPVFuncImplReduceAdd;

	case OpSMulExtended:
	case OpUMulExtended:
		return SPVFuncImplMulExtended;

	case OpAssumeTrueKHR:
	case OpExpectKHR:
		return SPVFuncImplAssume;

	default:
		break;
	}
	return SPVFuncImplNone;
}